

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

GLint __thiscall
glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::
compile_shader_and_get_compilation_result
          (TestCaseBase<glcts::ArraysOfArrays::Interface::ES> *this,string *tested_snippet,
          TestShaderType tested_shader_type,bool require_gpu_shader5)

{
  char *__s;
  int iVar1;
  GLint GVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  undefined **ppuVar5;
  GLint compile_status;
  string shader_source;
  char *code_ptr;
  GLint local_5c;
  undefined1 *local_58;
  undefined8 local_50;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 *local_38;
  long lVar4;
  
  local_5c = 1;
  iVar1 = (*this->context_id->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  local_50 = 0;
  local_48 = 0;
  local_58 = &local_48;
  if (tested_snippet->_M_string_length == 0) goto LAB_00b28a94;
  ppuVar5 = &Interface::ES::shader_version;
  if (require_gpu_shader5) {
    ppuVar5 = &Interface::ES::shader_version_gpu5;
  }
  __s = *ppuVar5;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_58,0,(char *)0x0,(ulong)__s);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
  case VERTEX_SHADER_TYPE:
    goto switchD_00b28807_caseD_0;
  case COMPUTE_SHADER_TYPE:
    break;
  case GEOMETRY_SHADER_TYPE:
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x286);
    goto LAB_00b28bd2;
  }
  std::__cxx11::string::append((char *)&local_58);
switchD_00b28807_caseD_0:
  std::__cxx11::string::_M_append((char *)&local_58,(ulong)(tested_snippet->_M_dataplus)._M_p);
  switch(tested_shader_type) {
  case FRAGMENT_SHADER_TYPE:
    GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b30);
    if (this->fragment_shader_object_id != 0) {
      __assert_fail("0 == fragment_shader_object_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x29c,
                    "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                   );
    }
    this->fragment_shader_object_id = GVar2;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create a fragment shader.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x29f);
    break;
  case VERTEX_SHADER_TYPE:
    GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8b31);
    if (this->vertex_shader_object_id != 0) {
      __assert_fail("0 == vertex_shader_object_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x292,
                    "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                   );
    }
    this->vertex_shader_object_id = GVar2;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create a vertex shader.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x295);
    break;
  case COMPUTE_SHADER_TYPE:
    GVar2 = (**(code **)(lVar4 + 0x3f0))(0x91b9);
    if (this->compute_shader_object_id != 0) {
      __assert_fail("0 == compute_shader_object_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2a6,
                    "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                   );
    }
    this->compute_shader_object_id = GVar2;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create a compute shader.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2a9);
    break;
  case GEOMETRY_SHADER_TYPE:
    GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8dd9);
    if (this->geometry_shader_object_id != 0) {
      __assert_fail("0 == geometry_shader_object_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2b0,
                    "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                   );
    }
    this->geometry_shader_object_id = GVar2;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create a geometry shader.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2b3);
    break;
  case TESSELATION_CONTROL_SHADER_TYPE:
    GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8e88);
    if (this->tess_ctrl_shader_object_id != 0) {
      __assert_fail("0 == tess_ctrl_shader_object_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2ba,
                    "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                   );
    }
    this->tess_ctrl_shader_object_id = GVar2;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create a tesselation control shader.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2bd);
    break;
  case TESSELATION_EVALUATION_SHADER_TYPE:
    GVar2 = (**(code **)(lVar4 + 0x3f0))(0x8e87);
    if (this->tess_eval_shader_object_id != 0) {
      __assert_fail("0 == tess_eval_shader_object_id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2c4,
                    "virtual glw::GLint glcts::ArraysOfArrays::TestCaseBase<glcts::ArraysOfArrays::Interface::ES>::compile_shader_and_get_compilation_result(const std::string &, TestShaderType, bool) [API = glcts::ArraysOfArrays::Interface::ES]"
                   );
    }
    this->tess_eval_shader_object_id = GVar2;
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Could not create a tesselation evaluation shader.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                    ,0x2c7);
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x2cd);
LAB_00b28bd2:
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_38 = local_58;
  (**(code **)(lVar4 + 0x12b8))(GVar2,1,&local_38,0);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glShaderSource() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2dc);
  (**(code **)(lVar4 + 0x248))(GVar2);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glCompileShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2e0);
  (**(code **)(lVar4 + 0xa70))(GVar2,0x8b81,&local_5c);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetShaderiv() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                  ,0x2e4);
LAB_00b28a94:
  GVar2 = local_5c;
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return GVar2;
}

Assistant:

glw::GLint TestCaseBase<API>::compile_shader_and_get_compilation_result(const std::string& tested_snippet,
																		TestShaderType	 tested_shader_type,
																		bool			   require_gpu_shader5)
{
	static const char* preamble_cs = "\n"
									 "layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
									 "\n";

	static const char* preamble_gs = "\n"
									 "layout(points)                           in;\n"
									 "layout(triangle_strip, max_vertices = 4) out;\n"
									 "\n";

	static const char* preamble_tcs = "\n"
									  "layout(vertices = 1) out;\n"
									  "\n";

	static const char* preamble_tes = "\n"
									  "layout(isolines, point_mode) in;\n"
									  "\n";

	glw::GLint			  compile_status   = GL_TRUE;
	const glw::Functions& gl			   = context_id.getRenderContext().getFunctions();
	glw::GLint			  shader_object_id = 0;

	std::string shader_source;

	if (true == tested_snippet.empty())
	{
		return compile_status;
	}

	if (require_gpu_shader5)
	{
		// Add the version number here, rather than in each individual test
		shader_source = API::shader_version_gpu5;
	}
	else
	{
		// Add the version number here, rather than in each individual test
		shader_source = API::shader_version;
	}

	/* Apply stage specific stuff */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
		break;
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
		break;
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
		shader_source += preamble_cs;
		break;
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
		shader_source += preamble_gs;
		break;
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
		shader_source += preamble_tcs;
		break;
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
		shader_source += preamble_tes;
		break;
	default:
		TCU_FAIL("Unrecognized shader type.");
		break;
	}

	shader_source += tested_snippet;

	/* Prepare shader object */
	switch (tested_shader_type)
	{
	case TestCaseBase<API>::VERTEX_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_VERTEX_SHADER);
		assert(0 == vertex_shader_object_id);
		vertex_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a vertex shader.");

		break;
	} /* case TestCaseBase<API>::VERTEX_SHADER_TYPE: */
	case TestCaseBase<API>::FRAGMENT_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_FRAGMENT_SHADER);
		assert(0 == fragment_shader_object_id);
		fragment_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a fragment shader.");

		break;
	} /* case TestCaseBase<API>::FRAGMENT_SHADER_TYPE: */
	case TestCaseBase<API>::COMPUTE_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_COMPUTE_SHADER);
		assert(0 == compute_shader_object_id);
		compute_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a compute shader.");

		break;
	} /* case TestCaseBase<API>::COMPUTE_SHADER_TYPE: */
	case TestCaseBase<API>::GEOMETRY_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_GEOMETRY_SHADER);
		assert(0 == geometry_shader_object_id);
		geometry_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a geometry shader.");

		break;
	} /* case TestCaseBase<API>::GEOMETRY_SHADER_TYPE: */
	case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		assert(0 == tess_ctrl_shader_object_id);
		tess_ctrl_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a tesselation control shader.");

		break;
	} /* case TestCaseBase<API>::TESSELATION_CONTROL_SHADER_TYPE: */
	case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE:
	{
		shader_object_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
		assert(0 == tess_eval_shader_object_id);
		tess_eval_shader_object_id = shader_object_id;

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create a tesselation evaluation shader.");

		break;
	} /* case TestCaseBase<API>::TESSELATION_EVALUATION_SHADER_TYPE: */
	default:
	{
		TCU_FAIL("Unrecognized shader type.");

		break;
	} /* default: */
	} /* switch (tested_shader_type) */

	/* Assign source code to the objects */
	const char* code_ptr = shader_source.c_str();

#if IS_DEBUG_DUMP_ALL_SHADERS
	context_id.getTestContext().getLog() << tcu::TestLog::Message << "Compiling: " << tcu::TestLog::EndMessage;
	context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(code_ptr);
#endif /* IS_DEBUG_DUMP_ALL_SHADERS */

	gl.shaderSource(shader_object_id, 1 /* count */, &code_ptr, NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed");

	/* Compile the shader */
	gl.compileShader(shader_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed");

	/* Get the compilation result. */
	gl.getShaderiv(shader_object_id, GL_COMPILE_STATUS, &compile_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed");

#if IS_DEBUG
	if (GL_TRUE != compile_status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Error log length */
		gl.getShaderiv(shader_object_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length, 0);

		/* Get error log */
		gl.getShaderInfoLog(shader_object_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		context_id.getTestContext().getLog() << tcu::TestLog::Message << "Error message: " << &message[0]
											 << tcu::TestLog::EndMessage;

#if IS_DEBUG_DUMP_ALL_SHADERS
#else  /* IS_DEBUG_DUMP_ALL_SHADERS */
		context_id.getTestContext().getLog() << tcu::TestLog::KernelSource(code_ptr);
#endif /* IS_DEBUG_DUMP_ALL_SHADERS */
	}
#endif /* IS_DEBUG */

	return compile_status;
}